

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O0

int StringToInt(tchar_t *In,int Hex)

{
  char *Mask;
  bool local_19;
  int local_18;
  uint local_14;
  int v;
  int Hex_local;
  tchar_t *In_local;
  
  local_18 = 0;
  local_14 = Hex;
  _v = In;
  if (Hex < 0) {
    ExprSkipSpace((tchar_t **)&v);
    local_19 = false;
    if (*_v == '0') {
      local_19 = _v[1] == 'x';
    }
    local_14 = (uint)local_19;
    if (local_14 != 0) {
      _v = _v + 2;
    }
  }
  Mask = "%d";
  if (local_14 != 0) {
    Mask = "%X";
  }
  stscanf(_v,Mask,&local_18);
  return local_18;
}

Assistant:

int StringToInt(const tchar_t* In, int Hex)
{
    int v=0;
    if (Hex<0)
    {
        ExprSkipSpace(&In);
        Hex = In[0]=='0' && In[1]=='x';
        if (Hex) In+=2;
    }
    stscanf(In,Hex ? T("%X"):T("%d"),&v);
    return v;
}